

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlineedit_p.cpp
# Opt level: O0

void __thiscall QLineEditPrivate::connectCompleter(QLineEditPrivate *this)

{
  Object *receiverPrivate;
  Object *extraout_RDX;
  QLineEditPrivate *in_RDI;
  long in_FS_OFFSET;
  QLineEdit *q;
  offset_in_QLineEdit_to_subr *in_stack_ffffffffffffff80;
  ContextType *in_stack_ffffffffffffff88;
  Object *in_stack_ffffffffffffff90;
  ConnectionType type;
  Object *sender;
  offset_in_QCompleter_to_subr signal;
  ConnectionType in_stack_ffffffffffffffd0;
  Connection local_28;
  code *local_20;
  undefined8 local_18;
  Connection local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  q_func(in_RDI);
  QWidgetLineControl::completer((QWidgetLineControl *)0x5d1062);
  signal = 0;
  receiverPrivate =
       (Object *)
       QNonConstOverload<QString_const&>::operator()
                 ((QNonConstOverload<QString_const&> *)&qOverload<QString_const&>,
                  (offset_in_QCompleter_to_subr)QCompleter::activated);
  local_20 = QLineEdit::setText;
  local_18 = 0;
  sender = extraout_RDX;
  QObject::connect<void(QCompleter::*)(QString_const&),void(QLineEdit::*)(QString_const&)>
            (in_stack_ffffffffffffff90,signal,in_stack_ffffffffffffff88,in_stack_ffffffffffffff80,
             in_stack_ffffffffffffffd0);
  QMetaObject::Connection::~Connection(&local_10);
  QWidgetLineControl::completer((QWidgetLineControl *)0x5d1111);
  type = AutoConnection;
  QNonConstOverload<QString_const&>::operator()
            ((QNonConstOverload<QString_const&> *)&qOverload<QString_const&>,
             (offset_in_QCompleter_to_subr)QCompleter::highlighted);
  QObjectPrivate::
  connect<void(QCompleter::*)(QString_const&),void(QLineEditPrivate::*)(QString_const&)>
            (sender,0,receiverPrivate,(Function)in_RDI,type);
  QMetaObject::Connection::~Connection(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QLineEditPrivate::connectCompleter()
{
    Q_Q(const QLineEdit);
    QObject::connect(control->completer(), qOverload<const QString &>(&QCompleter::activated),
                     q, &QLineEdit::setText);
    QObjectPrivate::connect(control->completer(), qOverload<const QString &>(&QCompleter::highlighted),
                            this, &QLineEditPrivate::completionHighlighted);
}